

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combininglock.h
# Opt level: O2

void __thiscall snmalloc::CombiningLockNode::wait<snmalloc::PALLinux>(CombiningLockNode *this)

{
  bool bVar1;
  int iVar2;
  LockStatus expected;
  
  for (iVar2 = -100; iVar2 != 0; iVar2 = iVar2 + 1) {
    if ((this->status)._M_i != WAITING) {
      return;
    }
  }
  expected = WAITING;
  bVar1 = std::atomic<snmalloc::CombiningLockNode::LockStatus>::compare_exchange_strong
                    (&this->status,&expected,SLEEPING,acq_rel);
  if ((bVar1) &&
     (PALLinux::wait_on_address<snmalloc::CombiningLockNode::LockStatus>(&this->status,SLEEPING),
     (this->status)._M_i == SLEEPING)) {
    error("Corruption in core locking primitive. Aborting execution.");
  }
  return;
}

Assistant:

void wait()
    {
      if constexpr (!use_wait_on_address<Pal>)
      {
        while (status.load(stl::memory_order_acquire) == LockStatus::WAITING)
          Aal::pause();
      }
      else
      {
        int remaining = 100;
        while (remaining > 0)
        {
          if (status.load(stl::memory_order_acquire) != LockStatus::WAITING)
            return;
          Aal::pause();
          remaining--;
        }
        LockStatus expected = LockStatus::WAITING;
        if (status.compare_exchange_strong(
              expected, LockStatus::SLEEPING, stl::memory_order_acq_rel))
        {
          Pal::wait_on_address(status, LockStatus::SLEEPING);
          if (status.load(stl::memory_order_acquire) == LockStatus::SLEEPING)
          {
            error("Corruption in core locking primitive. Aborting execution.");
          }
        }
      }
    }